

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

void cppassert::internal::BackTraceSymbol::findSymbolInBacktraceStr
               (char *backTraceSymbol,char **beginNamePtr,char **beginOffsetPtr,char **endOffsetPtr)

{
  char *local_48;
  char *position;
  char *endOffset;
  char *beginOffset;
  char *beginName;
  char **endOffsetPtr_local;
  char **beginOffsetPtr_local;
  char **beginNamePtr_local;
  char *backTraceSymbol_local;
  
  beginOffset = (char *)0x0;
  endOffset = (char *)0x0;
  position = (char *)0x0;
  local_48 = backTraceSymbol;
  do {
    if (*local_48 == '\0') {
LAB_0013bf2a:
      *beginNamePtr = beginOffset;
      *beginOffsetPtr = endOffset;
      *endOffsetPtr = position;
      return;
    }
    if (*local_48 == '(') {
      beginOffset = local_48;
    }
    else if (*local_48 == '+') {
      endOffset = local_48;
    }
    else if ((*local_48 == ')') && (endOffset != (char *)0x0)) {
      position = local_48;
      goto LAB_0013bf2a;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static void findSymbolInBacktraceStr(
                char *backTraceSymbol
                , char **beginNamePtr
                , char **beginOffsetPtr
                , char **endOffsetPtr)
    {
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;

        for (char *position = backTraceSymbol; *position; ++position)
        {
            if (*position == '(')
            {
                beginName = position;
            }
            else if (*position == '+')
            {
                beginOffset = position;
            }
            else if (*position == ')' && beginOffset)
            {
                endOffset = position;
                break;
            }
        }
        *beginNamePtr = beginName;
        *beginOffsetPtr = beginOffset;
        *endOffsetPtr = endOffset;
    }